

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_0::Border::Render(Border *this,Screen *screen)

{
  int y;
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  string *psVar4;
  Pixel *pPVar5;
  Pixel *pPVar6;
  int iVar7;
  
  (**(code **)((long)((((this->super_Node).children_.
                        super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     _vptr_Node + 0x20))();
  iVar7 = (this->super_Node).box_.x_min;
  if ((iVar7 < (this->super_Node).box_.x_max) &&
     (y = (this->super_Node).box_.y_min, y < (this->super_Node).box_.y_max)) {
    psVar4 = Screen::at_abi_cxx11_(screen,iVar7,y);
    std::__cxx11::string::_M_assign((string *)psVar4);
    psVar4 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_min);
    std::__cxx11::string::_M_assign((string *)psVar4);
    psVar4 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_max);
    std::__cxx11::string::_M_assign((string *)psVar4);
    psVar4 = Screen::at_abi_cxx11_
                       (screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_max);
    std::__cxx11::string::_M_assign((string *)psVar4);
    iVar7 = (this->super_Node).box_.x_min + 1;
    if (iVar7 < (this->super_Node).box_.x_max) {
      do {
        pPVar5 = Screen::PixelAt(screen,iVar7,(this->super_Node).box_.y_min);
        pPVar6 = Screen::PixelAt(screen,iVar7,(this->super_Node).box_.y_max);
        std::__cxx11::string::_M_assign((string *)&pPVar5->character);
        std::__cxx11::string::_M_assign((string *)&pPVar6->character);
        *(byte *)pPVar5 = *(byte *)pPVar5 | 0x80;
        *(byte *)pPVar6 = *(byte *)pPVar6 | 0x80;
        iVar7 = iVar7 + 1;
      } while (iVar7 < (this->super_Node).box_.x_max);
    }
    iVar7 = (this->super_Node).box_.y_min + 1;
    if (iVar7 < (this->super_Node).box_.y_max) {
      do {
        pPVar5 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,iVar7);
        pPVar6 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,iVar7);
        std::__cxx11::string::_M_assign((string *)&pPVar5->character);
        std::__cxx11::string::_M_assign((string *)&pPVar6->character);
        *(byte *)pPVar5 = *(byte *)pPVar5 | 0x80;
        *(byte *)pPVar6 = *(byte *)pPVar6 | 0x80;
        iVar7 = iVar7 + 1;
      } while (iVar7 < (this->super_Node).box_.y_max);
    }
    psVar1 = (this->super_Node).children_.
             super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->super_Node).children_.
              super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 == 0x20) {
      peVar2 = psVar1[1].super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (**(code **)((long)peVar2->_vptr_Node + 0x20))(peVar2,screen);
    }
    if ((this->foreground_color_).super__Optional_base<ftxui::Color,_true,_true>._M_payload.
        super__Optional_payload_base<ftxui::Color>._M_engaged == true) {
      iVar7 = (this->super_Node).box_.x_min;
      if (iVar7 <= (this->super_Node).box_.x_max) {
        do {
          pPVar5 = Screen::PixelAt(screen,iVar7,(this->super_Node).box_.y_min);
          pPVar5->foreground_color =
               (Color)(this->foreground_color_).super__Optional_base<ftxui::Color,_true,_true>.
                      _M_payload.super__Optional_payload_base<ftxui::Color>._M_payload;
          pPVar5 = Screen::PixelAt(screen,iVar7,(this->super_Node).box_.y_max);
          pPVar5->foreground_color =
               (Color)(this->foreground_color_).super__Optional_base<ftxui::Color,_true,_true>.
                      _M_payload.super__Optional_payload_base<ftxui::Color>._M_payload;
          bVar3 = iVar7 < (this->super_Node).box_.x_max;
          iVar7 = iVar7 + 1;
        } while (bVar3);
      }
      iVar7 = (this->super_Node).box_.y_min;
      if (iVar7 <= (this->super_Node).box_.y_max) {
        do {
          pPVar5 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,iVar7);
          pPVar5->foreground_color =
               (Color)(this->foreground_color_).super__Optional_base<ftxui::Color,_true,_true>.
                      _M_payload.super__Optional_payload_base<ftxui::Color>._M_payload;
          pPVar5 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,iVar7);
          pPVar5->foreground_color =
               (Color)(this->foreground_color_).super__Optional_base<ftxui::Color,_true,_true>.
                      _M_payload.super__Optional_payload_base<ftxui::Color>._M_payload;
          bVar3 = iVar7 < (this->super_Node).box_.y_max;
          iVar7 = iVar7 + 1;
        } while (bVar3);
      }
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max) {
      return;
    }

    screen.at(box_.x_min, box_.y_min) = charset_[0];  // NOLINT
    screen.at(box_.x_max, box_.y_min) = charset_[1];  // NOLINT
    screen.at(box_.x_min, box_.y_max) = charset_[2];  // NOLINT
    screen.at(box_.x_max, box_.y_max) = charset_[3];  // NOLINT

    for (int x = box_.x_min + 1; x < box_.x_max; ++x) {
      Pixel& p1 = screen.PixelAt(x, box_.y_min);
      Pixel& p2 = screen.PixelAt(x, box_.y_max);
      p1.character = charset_[4];  // NOLINT
      p2.character = charset_[4];  // NOLINT
      p1.automerge = true;
      p2.automerge = true;
    }
    for (int y = box_.y_min + 1; y < box_.y_max; ++y) {
      Pixel& p3 = screen.PixelAt(box_.x_min, y);
      Pixel& p4 = screen.PixelAt(box_.x_max, y);
      p3.character = charset_[5];  // NOLINT
      p4.character = charset_[5];  // NOLINT
      p3.automerge = true;
      p4.automerge = true;
    }

    // Draw title.
    if (children_.size() == 2) {
      children_[1]->Render(screen);
    }

    // Draw the border color.
    if (foreground_color_) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, box_.y_min).foreground_color = *foreground_color_;
        screen.PixelAt(x, box_.y_max).foreground_color = *foreground_color_;
      }
      for (int y = box_.y_min; y <= box_.y_max; ++y) {
        screen.PixelAt(box_.x_min, y).foreground_color = *foreground_color_;
        screen.PixelAt(box_.x_max, y).foreground_color = *foreground_color_;
      }
    }
  }